

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,std::default_delete<google::protobuf::json_internal::ResolverPool::Message>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,std::default_delete<google::protobuf::json_internal::ResolverPool::Message>>>>>
::find_or_prepare_insert_non_soo<std::__cxx11::string>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,std::default_delete<google::protobuf::json_internal::ResolverPool::Message>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,std::default_delete<google::protobuf::json_internal::ResolverPool::Message>>>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  size_t size;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  undefined4 uVar16;
  ulong uVar17;
  bool bVar18;
  char cVar19;
  ushort uVar20;
  MixingHashState MVar21;
  long lVar22;
  ulong uVar23;
  ctrl_t *pcVar24;
  ulong uVar25;
  anon_union_8_1_a8a14541_for_iterator_2 aVar26;
  bool bVar27;
  uint uVar28;
  uint64_t v;
  ulong uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  FindInfo FVar34;
  __m128i match;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_&>_>
  local_88;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  undefined1 local_58 [16];
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  size = key->_M_string_length;
  local_60 = key;
  MVar21 = hash_internal::MixingHashState::combine_contiguous
                     ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                      (uchar *)(key->_M_dataplus)._M_p,size);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = MVar21.state_ + size;
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar30 = SUB168(auVar31 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar31 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar29 = *(ulong *)(this + 0x10);
  uVar23 = (uVar30 >> 7 ^ uVar29 >> 0xc) & uVar2;
  auVar31 = ZEXT216(CONCAT11((char)uVar30,(char)uVar30) & 0x7f7f);
  auVar31 = pshuflw(auVar31,auVar31,0);
  local_58._0_4_ = auVar31._0_4_;
  local_58._4_4_ = local_58._0_4_;
  local_58._8_4_ = local_58._0_4_;
  local_58._12_4_ = local_58._0_4_;
  pcVar24 = (__return_storage_ptr__->first).ctrl_;
  aVar26 = (__return_storage_ptr__->first).field_1;
  bVar27 = __return_storage_ptr__->second;
  uVar25 = 0;
  do {
    pcVar1 = (char *)(uVar29 + uVar23);
    local_98 = *pcVar1;
    cStack_97 = pcVar1[1];
    cStack_96 = pcVar1[2];
    cStack_95 = pcVar1[3];
    uVar16 = *(undefined4 *)pcVar1;
    cVar19 = pcVar1[4];
    cVar5 = pcVar1[5];
    cVar6 = pcVar1[6];
    cVar7 = pcVar1[7];
    cVar8 = pcVar1[8];
    cVar9 = pcVar1[9];
    cVar10 = pcVar1[10];
    cVar11 = pcVar1[0xb];
    cVar12 = pcVar1[0xc];
    cVar13 = pcVar1[0xd];
    cVar14 = pcVar1[0xe];
    cVar15 = pcVar1[0xf];
    auVar32[0] = -(local_58[0] == local_98);
    auVar32[1] = -(local_58[1] == cStack_97);
    auVar32[2] = -(local_58[2] == cStack_96);
    auVar32[3] = -(local_58[3] == cStack_95);
    auVar32[4] = -(local_58[4] == cVar19);
    auVar32[5] = -(local_58[5] == cVar5);
    auVar32[6] = -(local_58[6] == cVar6);
    auVar32[7] = -(local_58[7] == cVar7);
    auVar32[8] = -(local_58[8] == cVar8);
    auVar32[9] = -(local_58[9] == cVar9);
    auVar32[10] = -(local_58[10] == cVar10);
    auVar32[0xb] = -(local_58[0xb] == cVar11);
    auVar32[0xc] = -(local_58[0xc] == cVar12);
    auVar32[0xd] = -(local_58[0xd] == cVar13);
    auVar32[0xe] = -(local_58[0xe] == cVar14);
    auVar32[0xf] = -(local_58[0xf] == cVar15);
    uVar20 = (ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf;
    uVar28 = (uint)uVar20;
    uVar17 = uVar25;
    while (uVar20 != 0) {
      uVar3 = 0;
      if (uVar28 != 0) {
        for (; (uVar28 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar25 = uVar3 + uVar23 & uVar2;
      local_88.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + uVar25 * 0x28);
      local_88.second.
      super__Tuple_impl<0UL,_const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_&>
      .
      super__Head_base<0UL,_const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,_std::default_delete<google::protobuf::json_internal::ResolverPool::Message>_>_&>
            )(*(long *)(this + 0x18) + 0x20 + uVar25 * 0x28);
      local_78 = uVar17;
      local_70 = uVar29;
      local_68 = uVar30;
      local_40.rhs = local_60;
      local_40.eq = (key_equal *)this;
      bVar18 = memory_internal::
               DecomposePairImpl<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,std::default_delete<google::protobuf::json_internal::ResolverPool::Message>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,std::default_delete<google::protobuf::json_internal::ResolverPool::Message>>>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message,std::default_delete<google::protobuf::json_internal::ResolverPool::Message>>const&>>
                         (&local_40,&local_88);
      if (bVar18) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar27;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        if (*(long *)(this + 0x10) != 0) {
          lVar22 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar25);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(uVar25 * 0x28 + lVar22);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_002e3ab0;
      }
      uVar20 = (ushort)(uVar28 - 1) & (ushort)uVar28;
      uVar28 = CONCAT22((short)(uVar28 - 1 >> 0x10),uVar20);
      local_98 = (char)uVar16;
      cStack_97 = (char)((uint)uVar16 >> 8);
      cStack_96 = (char)((uint)uVar16 >> 0x10);
      cStack_95 = (char)((uint)uVar16 >> 0x18);
      uVar17 = local_78;
      uVar29 = local_70;
      uVar30 = local_68;
    }
    auVar33[0] = -(local_98 == -0x80);
    auVar33[1] = -(cStack_97 == -0x80);
    auVar33[2] = -(cStack_96 == -0x80);
    auVar33[3] = -(cStack_95 == -0x80);
    auVar33[4] = -(cVar19 == -0x80);
    auVar33[5] = -(cVar5 == -0x80);
    auVar33[6] = -(cVar6 == -0x80);
    auVar33[7] = -(cVar7 == -0x80);
    auVar33[8] = -(cVar8 == -0x80);
    auVar33[9] = -(cVar9 == -0x80);
    auVar33[10] = -(cVar10 == -0x80);
    auVar33[0xb] = -(cVar11 == -0x80);
    auVar33[0xc] = -(cVar12 == -0x80);
    auVar33[0xd] = -(cVar13 == -0x80);
    auVar33[0xe] = -(cVar14 == -0x80);
    auVar33[0xf] = -(cVar15 == -0x80);
    uVar20 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf;
    if (uVar20 == 0) {
      uVar25 = uVar17 + 0x10;
      if (*(ulong *)this < uVar25) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar27;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>>, K = std::basic_string<char>]"
                     );
      }
      uVar23 = uVar23 + uVar17 + 0x10 & uVar2;
    }
    else {
      cVar19 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                         (*(ulong *)this,uVar30,*(ctrl_t **)(this + 0x10));
      if (cVar19 == '\0') {
        uVar28 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
      }
      else {
        uVar4 = 0xf;
        if (uVar20 != 0) {
          for (; uVar20 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar28 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      FVar34.offset = uVar28 + uVar23 & uVar2;
      FVar34.probe_length = uVar17;
      lVar22 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar30,FVar34,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar26;
        __return_storage_ptr__->second = bVar27;
        (__return_storage_ptr__->first).ctrl_ = pcVar24;
LAB_002e3ab0:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Message>>>]"
                     );
      }
      pcVar24 = (ctrl_t *)(*(long *)(this + 0x10) + lVar22);
      aVar26.slot_ = (slot_type *)(lVar22 * 0x28 + *(long *)(this + 0x18));
      bVar27 = true;
      uVar25 = uVar17;
    }
    if (uVar20 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar26;
      __return_storage_ptr__->second = bVar27;
      (__return_storage_ptr__->first).ctrl_ = pcVar24;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }